

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::CallIndirectExpr::CallIndirectExpr(CallIndirectExpr *this,Location *loc)

{
  Location local_38;
  Location *local_18;
  Location *loc_local;
  CallIndirectExpr *this_local;
  
  local_18 = loc;
  loc_local = (Location *)this;
  ExprMixin<(wabt::ExprType)13>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)13>,loc);
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__CallIndirectExpr_003b89a8;
  FuncDeclaration::FuncDeclaration(&this->decl);
  Location::Location(&local_38);
  Var::Var(&this->table,0xffffffff,&local_38);
  return;
}

Assistant:

explicit CallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::CallIndirect>(loc) {}